

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONChildren.h
# Opt level: O0

void __thiscall jsonChildren::clear(jsonChildren *this)

{
  json_index_t jVar1;
  allocator local_91;
  json_string local_90;
  allocator local_69;
  json_string local_68;
  allocator local_31;
  json_string local_30;
  jsonChildren *local_10;
  jsonChildren *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"Children is null clear",&local_31);
  JSONDebug::_JSON_ASSERT(this != (jsonChildren *)0x0,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if (this->array != (JSONNode **)0x0) {
    jVar1 = this->mycapacity;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_68,"mycapacity is not zero, but array is null",&local_69);
    JSONDebug::_JSON_ASSERT(jVar1 != 0,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    deleteAll(this);
    this->mysize = 0;
  }
  jVar1 = this->mysize;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"mysize is not zero after clear",&local_91);
  JSONDebug::_JSON_ASSERT(jVar1 == 0,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  return;
}

Assistant:

inline void clear() json_nothrow {
	   JSON_ASSERT(this != 0, JSON_TEXT("Children is null clear"));
	   if (json_likely(array != 0)){  //don't bother clearing anything if there is nothing in it
		  JSON_ASSERT(mycapacity != 0, JSON_TEXT("mycapacity is not zero, but array is null"));
		  deleteAll();
		  mysize = 0;
	   }
	   JSON_ASSERT(mysize == 0, JSON_TEXT("mysize is not zero after clear"));
    }